

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

float32 full_norm(vector_t *var,uint32 len)

{
  float64 __x;
  double dVar1;
  
  __x = determinant((float32 **)var,len);
  if (0.0 < (double)__x) {
    dVar1 = log((double)__x);
    return (float32)(float)(((double)(float)((double)len * 1.8378770664093453) + dVar1) * -0.5);
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x167,"Covariance matrix is not positive-definite: determinant is %g\n");
  __assert_fail("det > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x168,"float32 full_norm(vector_t *, uint32)");
}

Assistant:

float32
full_norm(vector_t *var,
	  uint32 len)
{
    float64 det;
    float32 p;

    det = determinant(var, len);
    /* Require covariance matrices to be positive-definite. */
    if (det <= 0) {
	E_ERROR("Covariance matrix is not positive-definite: determinant is %g\n",
		det);
	assert(det > 0);
    }
    p = len * log(2.0 * M_PI);

    return - 0.5 * (log(det) + p);
}